

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Vector<capnp::schema::Node::SourceInfo::Reader>::grow
          (Vector<capnp::schema::Node::SourceInfo::Reader> *this,size_t minCapacity)

{
  Reader *pRVar1;
  Reader *pRVar2;
  ulong uVar3;
  
  pRVar1 = (this->builder).endPtr;
  pRVar2 = (this->builder).ptr;
  uVar3 = 4;
  if (pRVar1 != pRVar2) {
    uVar3 = (((long)pRVar1 - (long)pRVar2) / 0x30) * 2;
  }
  if (minCapacity <= uVar3) {
    minCapacity = uVar3;
  }
  setCapacity(this,minCapacity);
  return;
}

Assistant:

inline size_t capacity() const { return endPtr - ptr; }